

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VMSR_VMRS(DisasContext_conflict1 *s,arg_VMSR_VMRS *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  int iVar2;
  TCGv_i32 pTVar3;
  TCGv_i32 arg2;
  TCGv_i32 tcg_rt;
  TCGv_i32 tcg_reg;
  TCGv_i32 pTStack_30;
  _Bool ignore_vfp_enabled;
  TCGv_i32 tmp;
  TCGContext_conflict1 *tcg_ctx;
  arg_VMSR_VMRS *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  tcg_reg._7_1_ = false;
  _Var1 = isar_feature_aa32_fpsp_v2(s->isar);
  if (!_Var1) {
    return false;
  }
  iVar2 = arm_dc_feature(s,9);
  if (((iVar2 != 0) && (a->rt == 0xf)) && ((a->l == 0 || (a->reg != 1)))) {
    return false;
  }
  switch(a->reg) {
  case 0:
    if ((s->user != 0) && (_Var1 = isar_feature_aa32_fpsp_v3(s->isar), _Var1)) {
      return false;
    }
    tcg_reg._7_1_ = true;
    break;
  case 1:
    break;
  default:
    return false;
  case 5:
    if ((s->user != 0) || (iVar2 = arm_dc_feature(s,0x1b), iVar2 == 0)) {
      return false;
    }
    tcg_reg._7_1_ = true;
    break;
  case 6:
  case 7:
    if ((s->user != 0) || (iVar2 = arm_dc_feature(s,0x13), iVar2 == 0)) {
      return false;
    }
    tcg_reg._7_1_ = true;
    break;
  case 8:
    if (s->user != 0) {
      return false;
    }
    tcg_reg._7_1_ = true;
    break;
  case 9:
  case 10:
    if ((s->user != 0) || (_Var1 = isar_feature_aa32_fpsp_v3(s->isar), _Var1)) {
      return false;
    }
  }
  _Var1 = full_vfp_access_check(s,tcg_reg._7_1_);
  if (!_Var1) {
    return true;
  }
  if (a->l == 0) {
    switch(a->reg) {
    case 0:
    case 5:
    case 6:
    case 7:
      return true;
    case 1:
      pTVar3 = load_reg(s,a->rt);
      gen_helper_vfp_set_fpscr_aarch64(tcg_ctx_00,tcg_ctx_00->cpu_env,pTVar3);
      tcg_temp_free_i32(tcg_ctx_00,pTVar3);
      gen_lookup_tb(s);
      return true;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-vfp.inc.c"
                 ,0x30f,(char *)0x0);
    case 8:
      pTVar3 = load_reg(s,a->rt);
      tcg_gen_andi_i32_aarch64(tcg_ctx_00,pTVar3,pTVar3,0x40000000);
      store_cpu_offset(tcg_ctx_00,pTVar3,a->reg * 4 + 0x2e68);
      gen_lookup_tb(s);
      return true;
    case 9:
    case 10:
      pTVar3 = load_reg(s,a->rt);
      store_cpu_offset(tcg_ctx_00,pTVar3,a->reg * 4 + 0x2e68);
      return true;
    }
  }
  iVar2 = a->reg;
  if (iVar2 == 0) {
LAB_007aa95d:
    if (s->current_el == 1) {
      gen_set_condexec(s);
      gen_set_pc_im(s,s->pc_curr);
      pTVar3 = tcg_const_i32_aarch64(tcg_ctx_00,a->reg);
      arg2 = tcg_const_i32_aarch64(tcg_ctx_00,a->rt);
      gen_helper_check_hcr_el2_trap(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,pTVar3);
      tcg_temp_free_i32(tcg_ctx_00,pTVar3);
      tcg_temp_free_i32(tcg_ctx_00,arg2);
    }
  }
  else {
    if (iVar2 == 1) {
      if (a->rt == 0xf) {
        pTStack_30 = load_cpu_offset(tcg_ctx_00,0x2e6c);
        tcg_gen_andi_i32_aarch64(tcg_ctx_00,pTStack_30,pTStack_30,-0x10000000);
      }
      else {
        pTStack_30 = tcg_temp_new_i32(tcg_ctx_00);
        gen_helper_vfp_get_fpscr_aarch64(tcg_ctx_00,pTStack_30,tcg_ctx_00->cpu_env);
      }
      goto LAB_007aaa79;
    }
    if (iVar2 - 5U < 3) goto LAB_007aa95d;
    if (2 < iVar2 - 8U) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-vfp.inc.c"
                 ,0x2e6,(char *)0x0);
    }
  }
  pTStack_30 = load_cpu_offset(tcg_ctx_00,a->reg * 4 + 0x2e68);
LAB_007aaa79:
  if (a->rt == 0xf) {
    gen_set_cpsr(tcg_ctx_00,pTStack_30,0xf0000000);
    tcg_temp_free_i32(tcg_ctx_00,pTStack_30);
  }
  else {
    store_reg(s,a->rt,pTStack_30);
  }
  return true;
}

Assistant:

static bool trans_VMSR_VMRS(DisasContext *s, arg_VMSR_VMRS *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp = 0;
    bool ignore_vfp_enabled = false;

    if (!dc_isar_feature(aa32_fpsp_v2, s)) {
        return false;
    }

    if (arm_dc_feature(s, ARM_FEATURE_M)) {
        /*
         * The only M-profile VFP vmrs/vmsr sysreg is FPSCR.
         * Accesses to R15 are UNPREDICTABLE; we choose to undef.
         * (FPSCR -> r15 is a special case which writes to the PSR flags.)
         */
        if (a->rt == 15 && (!a->l || a->reg != ARM_VFP_FPSCR)) {
            return false;
        }
    }

    switch (a->reg) {
    case ARM_VFP_FPSID:
        /*
         * VFPv2 allows access to FPSID from userspace; VFPv3 restricts
         * all ID registers to privileged access only.
         */
        if (IS_USER(s) && dc_isar_feature(aa32_fpsp_v3, s)) {
            return false;
        }
        ignore_vfp_enabled = true;
        break;
    case ARM_VFP_MVFR0:
    case ARM_VFP_MVFR1:
        if (IS_USER(s) || !arm_dc_feature(s, ARM_FEATURE_MVFR)) {
            return false;
        }
        ignore_vfp_enabled = true;
        break;
    case ARM_VFP_MVFR2:
        if (IS_USER(s) || !arm_dc_feature(s, ARM_FEATURE_V8)) {
            return false;
        }
        ignore_vfp_enabled = true;
        break;
    case ARM_VFP_FPSCR:
        break;
    case ARM_VFP_FPEXC:
        if (IS_USER(s)) {
            return false;
        }
        ignore_vfp_enabled = true;
        break;
    case ARM_VFP_FPINST:
    case ARM_VFP_FPINST2:
        /* Not present in VFPv3 */
        if (IS_USER(s) || dc_isar_feature(aa32_fpsp_v3, s)) {
            return false;
        }
        break;
    default:
        return false;
    }

    if (!full_vfp_access_check(s, ignore_vfp_enabled)) {
        return true;
    }

    if (a->l) {
        /* VMRS, move VFP special register to gp register */
        switch (a->reg) {
        case ARM_VFP_MVFR0:
        case ARM_VFP_MVFR1:
        case ARM_VFP_MVFR2:
        case ARM_VFP_FPSID:
            if (s->current_el == 1) {
                TCGv_i32 tcg_reg, tcg_rt;

                gen_set_condexec(s);
                gen_set_pc_im(s, s->pc_curr);
                tcg_reg = tcg_const_i32(tcg_ctx, a->reg);
                tcg_rt = tcg_const_i32(tcg_ctx, a->rt);
                gen_helper_check_hcr_el2_trap(tcg_ctx, tcg_ctx->cpu_env, tcg_rt, tcg_reg);
                tcg_temp_free_i32(tcg_ctx, tcg_reg);
                tcg_temp_free_i32(tcg_ctx, tcg_rt);
            }
            /* fall through */
        case ARM_VFP_FPEXC:
        case ARM_VFP_FPINST:
        case ARM_VFP_FPINST2:
            tmp = load_cpu_field(tcg_ctx, vfp.xregs[a->reg]);
            break;
        case ARM_VFP_FPSCR:
            if (a->rt == 15) {
                tmp = load_cpu_field(tcg_ctx, vfp.xregs[ARM_VFP_FPSCR]);
                tcg_gen_andi_i32(tcg_ctx, tmp, tmp, 0xf0000000);
            } else {
                tmp = tcg_temp_new_i32(tcg_ctx);
                gen_helper_vfp_get_fpscr(tcg_ctx, tmp, tcg_ctx->cpu_env);
            }
            break;
        default:
            g_assert_not_reached();
        }

        if (a->rt == 15) {
            /* Set the 4 flag bits in the CPSR.  */
            gen_set_nzcv(tmp);
            tcg_temp_free_i32(tcg_ctx, tmp);
        } else {
            store_reg(s, a->rt, tmp);
        }
    } else {
        /* VMSR, move gp register to VFP special register */
        switch (a->reg) {
        case ARM_VFP_FPSID:
        case ARM_VFP_MVFR0:
        case ARM_VFP_MVFR1:
        case ARM_VFP_MVFR2:
            /* Writes are ignored.  */
            break;
        case ARM_VFP_FPSCR:
            tmp = load_reg(s, a->rt);
            gen_helper_vfp_set_fpscr(tcg_ctx, tcg_ctx->cpu_env, tmp);
            tcg_temp_free_i32(tcg_ctx, tmp);
            gen_lookup_tb(s);
            break;
        case ARM_VFP_FPEXC:
            /*
             * TODO: VFP subarchitecture support.
             * For now, keep the EN bit only
             */
            tmp = load_reg(s, a->rt);
            tcg_gen_andi_i32(tcg_ctx, tmp, tmp, 1 << 30);
            store_cpu_field(tcg_ctx, tmp, vfp.xregs[a->reg]);
            gen_lookup_tb(s);
            break;
        case ARM_VFP_FPINST:
        case ARM_VFP_FPINST2:
            tmp = load_reg(s, a->rt);
            store_cpu_field(tcg_ctx, tmp, vfp.xregs[a->reg]);
            break;
        default:
            g_assert_not_reached();
        }
    }

    return true;
}